

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.cpp
# Opt level: O0

bool __thiscall
Metal::Scatter(Metal *this,Ray *ray_in,hit_record_t *hit_record,Vec3 *attenuation,Ray *ray_out)

{
  undefined8 *in_RCX;
  Vec3 *v1;
  long in_RDX;
  Ray *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  float fVar1;
  Vec3 _reflected;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  byte bVar2;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  Vec3 *direction;
  Vec3 *in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  Vec3 *in_stack_ffffffffffffff78;
  Vec3 local_80;
  Vec3 local_74;
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined8 uStack_54;
  Vec3 local_40;
  Vec3 local_34;
  undefined8 *local_28;
  undefined8 *local_20;
  long local_18;
  Ray *local_10;
  
  direction = &local_40;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Ray::GetDirection((Ray *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  reflect(in_stack_ffffffffffffff78,
          (Vec3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  Vec3::~Vec3(&local_40);
  v1 = (Vec3 *)(local_18 + 0xc);
  random_in_unit_disk();
  operator*((float)((ulong)v1 >> 0x20),
            (Vec3 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  operator+(v1,(Vec3 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  fVar1 = Ray::GetTime(local_10);
  Ray::Ray((Ray *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
           in_stack_ffffffffffffff68,direction,(float)((ulong)in_RDI >> 0x20));
  *(ulong *)((long)local_28 + 0xc) = CONCAT44(uStack_58,uStack_5c);
  *(undefined8 *)((long)local_28 + 0x14) = uStack_54;
  *local_28 = local_68;
  local_28[1] = CONCAT44(uStack_5c,uStack_60);
  Ray::~Ray((Ray *)CONCAT44(fVar1,in_stack_ffffffffffffff40));
  Vec3::~Vec3(&local_74);
  Vec3::~Vec3(&local_80);
  Vec3::~Vec3((Vec3 *)&stack0xffffffffffffff74);
  (**(code **)(**(long **)(in_RDI + 8) + 0x10))
            (*(undefined4 *)(local_18 + 4),&stack0xffffffffffffff68,*(long **)(in_RDI + 8),
             local_18 + 0xc);
  *(float *)(local_20 + 1) = in_stack_ffffffffffffff70;
  *local_20 = in_stack_ffffffffffffff68;
  Vec3::~Vec3((Vec3 *)&stack0xffffffffffffff68);
  fVar1 = dot(&local_34,(Vec3 *)(local_18 + 0x18));
  bVar2 = 0.0 < fVar1;
  Vec3::~Vec3(&local_34);
  return (bool)(bVar2 & 1);
}

Assistant:

bool
Metal::Scatter(const Ray& ray_in, hit_record_t& hit_record, Vec3& attenuation, Ray& ray_out) const
{
    Vec3 _reflected = reflect(ray_in.GetDirection(), hit_record.m_normal);
    ray_out         = Ray(hit_record.m_point, _reflected + m_fuzz*random_in_unit_disk(), ray_in.GetTime());
    attenuation     = m_albedo->GetValue(hit_record.m_u, hit_record.m_v, hit_record.m_point);

    return (dot(_reflected, hit_record.m_normal) > 0.0f);
}